

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_MultipleInputsWithImport_DescriptorSetIn_Test::TestBody
          (CommandLineInterfaceTest_MultipleInputsWithImport_DescriptorSetIn_Test *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  RepeatedPtrFieldBase *this_00;
  pointer pcVar4;
  void *pvVar5;
  Arena *pAVar6;
  AlphaNum *in_R8;
  AlphaNum *c;
  size_t in_R9;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view filename;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string_view value_09;
  string_view value_10;
  string_view filename_00;
  string_view format;
  string_view format_00;
  string result_1;
  string result;
  FileDescriptorSet file_descriptor_set;
  undefined1 local_178 [32];
  string local_158;
  undefined1 local_128 [48];
  undefined1 local_f8 [48];
  string local_c8;
  string local_a8;
  char *local_88;
  pointer local_80;
  undefined1 local_78 [72];
  
  c = (AlphaNum *)local_178;
  FileDescriptorSet::FileDescriptorSet((FileDescriptorSet *)local_78,(Arena *)0x0);
  this_00 = (RepeatedPtrFieldBase *)(local_78 + 0x28);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<google::protobuf::FileDescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value._M_str = "foo.proto";
  value._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 200),value,pAVar6);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar5 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_00._M_str = "Foo";
  value_00._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0xd8),value_00,pAVar6);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<google::protobuf::FileDescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_01._M_str = "bar.proto";
  value_01._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 200),value_01,pAVar6);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[10]>
            ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)pvVar5 + 0x18),(char (*) [10])0x11e3a80);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar5 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_02._M_str = "Bar";
  value_02._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0xd8),value_02,pAVar6);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar5 + 0x18),
                      Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 4;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_03._M_str = "Baz";
  value_03._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x28),value_03,pAVar6);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_04._M_str = "a";
  value_04._M_len = 1;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x18),value_04,pAVar6);
  *(undefined4 *)((long)pvVar5 + 0x48) = 1;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 0x40;
  filename._M_str = "foo_and_bar.bin";
  filename._M_len = 0xf;
  CommandLineInterfaceTest::WriteDescriptorSet
            (&this->super_CommandLineInterfaceTest,filename,(FileDescriptorSet *)local_78);
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
            (this_00);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<google::protobuf::FileDescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_05._M_str = "baz.proto";
  value_05._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 200),value_05,pAVar6);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar5 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_06._M_str = "Baz";
  value_06._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0xd8),value_06,pAVar6);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<google::protobuf::FileDescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_07._M_str = "bat.proto";
  value_07._M_len = 9;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 200),value_07,pAVar6);
  protobuf::internal::AddToRepeatedPtrField<char_const(&)[10]>
            ((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)pvVar5 + 0x18),(char (*) [10])0x11e3a80);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar5 + 0x30),
                      Arena::DefaultConstruct<google::protobuf::DescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_08._M_str = "Bat";
  value_08._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0xd8),value_08,pAVar6);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)((long)pvVar5 + 0x18),
                      Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 4;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_09._M_str = "Baz";
  value_09._M_len = 3;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x28),value_09,pAVar6);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_10._M_str = "a";
  value_10._M_len = 1;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x18),value_10,pAVar6);
  *(undefined4 *)((long)pvVar5 + 0x48) = 1;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 0x40;
  filename_00._M_str = "baz_and_bat.bin";
  filename_00._M_len = 0xf;
  CommandLineInterfaceTest::WriteDescriptorSet
            (&this->super_CommandLineInterfaceTest,filename_00,(FileDescriptorSet *)local_78);
  local_158._M_dataplus._M_p = &DAT_00000017;
  local_158._M_string_length = 0x11de565;
  local_f8._0_8_ = strlen(":");
  local_f8._8_8_ = ":";
  local_128._0_8_ = &DAT_00000017;
  local_128._8_8_ = "$tmpdir/baz_and_bat.bin";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_178,(lts_20250127 *)&local_158,(AlphaNum *)local_f8,
             (AlphaNum *)local_128,in_R8);
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  local_88 = (char *)local_178._8_8_;
  local_80 = (pointer)local_178._0_8_;
  format._M_str = (char *)&local_88;
  format._M_len =
       (size_t)
       "protocol_compiler --test_out=$$tmpdir --plug_out=$$tmpdir --descriptor_set_in=$0 foo.proto bar.proto"
  ;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_a8,(Nonnull<std::string_*>)&DAT_00000064,format,
             (Nullable<const_absl::string_view_*>)0x1,in_R9);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  pcVar1 = local_178 + 0x10;
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  paVar2 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"test_generator","");
  pcVar4 = local_f8 + 0x10;
  local_f8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"foo.proto,bar.proto","");
  pcVar3 = local_128 + 0x10;
  local_128._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"foo.proto","");
  local_178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Foo","");
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_158,(string *)local_f8,(string *)local_128
             ,(string *)local_178);
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if ((pointer)local_128._0_8_ != pcVar3) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if ((pointer)local_f8._0_8_ != pcVar4) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"test_generator","");
  local_f8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"foo.proto,bar.proto","");
  local_128._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"bar.proto","");
  local_178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Bar","");
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_158,(string *)local_f8,(string *)local_128
             ,(string *)local_178);
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if ((pointer)local_128._0_8_ != pcVar3) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if ((pointer)local_f8._0_8_ != pcVar4) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"test_plugin","");
  local_f8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"foo.proto,bar.proto","");
  local_128._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"foo.proto","");
  local_178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Foo","");
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_158,(string *)local_f8,(string *)local_128
             ,(string *)local_178);
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if ((pointer)local_128._0_8_ != pcVar3) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if ((pointer)local_f8._0_8_ != pcVar4) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"test_plugin","");
  local_f8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"foo.proto,bar.proto","");
  local_128._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"bar.proto","");
  local_178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Bar","");
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_158,(string *)local_f8,(string *)local_128
             ,(string *)local_178);
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if ((pointer)local_128._0_8_ != pcVar3) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if ((pointer)local_f8._0_8_ != pcVar4) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = &DAT_00000017;
  local_158._M_string_length = 0x11de565;
  local_f8._0_8_ = strlen(":");
  local_f8._8_8_ = ":";
  local_128._0_8_ = &DAT_00000017;
  local_128._8_8_ = "$tmpdir/baz_and_bat.bin";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_178,(lts_20250127 *)&local_158,(AlphaNum *)local_f8,
             (AlphaNum *)local_128,c);
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_88 = (char *)local_178._8_8_;
  local_80 = (pointer)local_178._0_8_;
  format_00._M_str = (char *)&local_88;
  format_00._M_len =
       (size_t)
       "protocol_compiler --test_out=$$tmpdir --plug_out=$$tmpdir --descriptor_set_in=$0 baz.proto bat.proto"
  ;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_c8,(Nonnull<std::string_*>)&DAT_00000064,format_00,
             (Nullable<const_absl::string_view_*>)0x1,in_R9);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"test_generator","");
  local_f8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"baz.proto,bat.proto","");
  local_128._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"baz.proto","");
  local_178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Baz","");
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_158,(string *)local_f8,(string *)local_128
             ,(string *)local_178);
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if ((pointer)local_128._0_8_ != pcVar3) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if ((pointer)local_f8._0_8_ != pcVar4) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"test_generator","");
  local_f8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"baz.proto,bat.proto","");
  local_128._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"bat.proto","");
  local_178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Bat","");
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_158,(string *)local_f8,(string *)local_128
             ,(string *)local_178);
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if ((pointer)local_128._0_8_ != pcVar3) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if ((pointer)local_f8._0_8_ != pcVar4) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"test_plugin","");
  local_f8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"baz.proto,bat.proto","");
  local_128._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"baz.proto","");
  local_178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Baz","");
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_158,(string *)local_f8,(string *)local_128
             ,(string *)local_178);
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if ((pointer)local_128._0_8_ != pcVar3) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if ((pointer)local_f8._0_8_ != pcVar4) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"test_plugin","");
  local_f8._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"baz.proto,bat.proto","");
  local_128._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"bat.proto","");
  local_178._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"Bat","");
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_158,(string *)local_f8,(string *)local_128
             ,(string *)local_178);
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
  }
  if ((pointer)local_128._0_8_ != pcVar3) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if ((pointer)local_f8._0_8_ != pcVar4) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  FileDescriptorSet::~FileDescriptorSet((FileDescriptorSet *)local_78);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, MultipleInputsWithImport_DescriptorSetIn) {
  // Test parsing multiple input files with an import of a separate file.
  FileDescriptorSet file_descriptor_set;

  FileDescriptorProto* file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("foo.proto");
  file_descriptor_proto->add_message_type()->set_name("Foo");

  file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("bar.proto");
  file_descriptor_proto->add_dependency("baz.proto");
  DescriptorProto* message = file_descriptor_proto->add_message_type();
  message->set_name("Bar");
  FieldDescriptorProto* field = message->add_field();
  field->set_type_name("Baz");
  field->set_name("a");
  field->set_number(1);

  WriteDescriptorSet("foo_and_bar.bin", &file_descriptor_set);

  file_descriptor_set.clear_file();
  file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("baz.proto");
  file_descriptor_proto->add_message_type()->set_name("Baz");

  file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("bat.proto");
  file_descriptor_proto->add_dependency("baz.proto");
  message = file_descriptor_proto->add_message_type();
  message->set_name("Bat");
  field = message->add_field();
  field->set_type_name("Baz");
  field->set_name("a");
  field->set_number(1);

  WriteDescriptorSet("baz_and_bat.bin", &file_descriptor_set);
  Run(absl::Substitute(
      "protocol_compiler --test_out=$$tmpdir --plug_out=$$tmpdir "
      "--descriptor_set_in=$0 foo.proto bar.proto",
      absl::StrCat("$tmpdir/foo_and_bar.bin",
                   CommandLineInterface::kPathSeparator,
                   "$tmpdir/baz_and_bat.bin")));

  ExpectNoErrors();
  ExpectGeneratedWithMultipleInputs("test_generator", "foo.proto,bar.proto",
                                    "foo.proto", "Foo");
  ExpectGeneratedWithMultipleInputs("test_generator", "foo.proto,bar.proto",
                                    "bar.proto", "Bar");
  ExpectGeneratedWithMultipleInputs("test_plugin", "foo.proto,bar.proto",
                                    "foo.proto", "Foo");
  ExpectGeneratedWithMultipleInputs("test_plugin", "foo.proto,bar.proto",
                                    "bar.proto", "Bar");

  Run(absl::Substitute(
      "protocol_compiler --test_out=$$tmpdir --plug_out=$$tmpdir "
      "--descriptor_set_in=$0 baz.proto bat.proto",
      absl::StrCat("$tmpdir/foo_and_bar.bin",
                   CommandLineInterface::kPathSeparator,
                   "$tmpdir/baz_and_bat.bin")));

  ExpectNoErrors();
  ExpectGeneratedWithMultipleInputs("test_generator", "baz.proto,bat.proto",
                                    "baz.proto", "Baz");
  ExpectGeneratedWithMultipleInputs("test_generator", "baz.proto,bat.proto",
                                    "bat.proto", "Bat");
  ExpectGeneratedWithMultipleInputs("test_plugin", "baz.proto,bat.proto",
                                    "baz.proto", "Baz");
  ExpectGeneratedWithMultipleInputs("test_plugin", "baz.proto,bat.proto",
                                    "bat.proto", "Bat");
}